

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O0

void x86_64_pbsloadi(dill_stream s,int type,int junk,int dest,int src,long offset)

{
  ulong uVar1;
  int in_ECX;
  uint in_ESI;
  long in_RDI;
  dill_stream in_R9;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int ltype;
  int fdest;
  int rex;
  uint src_00;
  uint dest_00;
  uint rex_00;
  int iVar2;
  int local_14;
  
  rex_00 = 0;
  if (in_ESI == 9) {
    dest_00 = 4;
    local_14 = 0;
  }
  else {
    dest_00 = in_ESI;
    local_14 = in_ECX;
    if (in_ESI == 10) {
      dest_00 = 6;
      local_14 = 0;
    }
  }
  src_00 = in_ESI;
  x86_64_ploadi(_fdest,ltype,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,in_RDI);
  if (7 < local_14) {
    rex_00 = rex_00 | 1;
  }
  uVar1 = (ulong)in_ESI;
  switch(uVar1) {
  case 0:
  case 1:
    break;
  case 2:
  case 3:
    BYTE_OUT2R(in_R9,rex_00,in_ECX,dest_00);
    x86_64_rshi((dill_stream)CONCAT44(dest_00,src_00),(int)(uVar1 >> 0x20),(int)uVar1,0);
    break;
  case 6:
  case 7:
  case 8:
    rex_00 = rex_00 | 8;
  case 4:
  case 5:
    BYTE_OUT2R(in_R9,rex_00,in_ECX,dest_00);
    break;
  case 9:
    iVar2 = 0;
    if (7 < in_ECX) {
      iVar2 = 4;
    }
    x86_64_bswap(in_R9,iVar2,in_ECX,dest_00,src_00);
    BYTE_OUT1R3(in_R9,iVar2,in_ECX,dest_00,src_00,(int)(uVar1 >> 0x20));
    break;
  case 10:
    iVar2 = 8;
    if (7 < in_ECX) {
      iVar2 = 0xc;
    }
    x86_64_bswap(in_R9,iVar2,in_ECX,dest_00,src_00);
    BYTE_OUT1R3(in_R9,iVar2,in_ECX,dest_00,src_00,(int)(uVar1 >> 0x20));
  }
  return;
}

Assistant:

extern void
x86_64_pbsloadi(dill_stream s,
                int type,
                int junk,
                int dest,
                int src,
                IMM_TYPE offset)
{
    int rex = 0;
    int fdest = dest;
    int ltype = type;
    switch (type) {
    case DILL_D:
        ltype = DILL_L;
        fdest = dest;
        dest = EAX;
        break;
    case DILL_F:
        ltype = DILL_I;
        fdest = dest;
        dest = EAX;
        break;
    }
    x86_64_ploadi(s, ltype, junk, dest, src, offset);
    if (dest > RDI)
        rex |= REX_B;
    switch (type) {
    case DILL_F:
        rex = 0;
        if (fdest > RDI)
            rex |= REX_R;
        x86_64_bswap(s, 0, DILL_I, EAX, EAX);
        BYTE_OUT1R3(s, 0x66, rex, 0x0f, 0x6e, ModRM(0x3, fdest, EAX));
        break;
    case DILL_D:
        rex = REX_W;
        if (fdest > RDI)
            rex |= REX_R;
        x86_64_bswap(s, 0, DILL_L, EAX, EAX);
        BYTE_OUT1R3(s, 0x66, rex, 0x0f, 0x6e, ModRM(0x3, fdest, EAX));
        break;
    case DILL_L:
    case DILL_UL:
    case DILL_P:
        rex |= REX_W;
        /* falling through */
    case DILL_I:
    case DILL_U:
        BYTE_OUT2R(s, rex, 0x0f, 0xc8 + (dest & 0x7)); /* byteswap dest */
        break;
    case DILL_S:
    case DILL_US:
        /* byteswap 32 bits and shift down 16 */
        BYTE_OUT2R(s, rex, 0x0f, 0xc8 + (dest & 0x7)); /* byteswap dest */
        x86_64_rshi(s, dest, dest, 16);
        break;
    case DILL_C:
    case DILL_UC:
        break;
    }
}